

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O0

function_map * skiwi::generate_function_map_abi_cxx11_(void)

{
  map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  *in_RDI;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_void_(*)(asmcode_&,_const_compiler_options_&)>_>::value,_pair<iterator,_bool>_>
  _Var1;
  _func_void_asmcode_ptr_compiler_options_ptr *local_2398;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_2390;
  _Base_ptr local_2368;
  undefined1 local_2360;
  _func_void_asmcode_ptr_compiler_options_ptr *local_2358;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_2350;
  _Base_ptr local_2328;
  undefined1 local_2320;
  _func_void_asmcode_ptr_compiler_options_ptr *local_2318;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_2310;
  _Base_ptr local_22e8;
  undefined1 local_22e0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_22d8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_22d0;
  _Base_ptr local_22a8;
  undefined1 local_22a0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_2298;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_2290;
  _Base_ptr local_2268;
  undefined1 local_2260;
  _func_void_asmcode_ptr_compiler_options_ptr *local_2258;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_2250;
  _Base_ptr local_2228;
  undefined1 local_2220;
  _func_void_asmcode_ptr_compiler_options_ptr *local_2218;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_2210;
  _Base_ptr local_21e8;
  undefined1 local_21e0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_21d8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_21d0;
  _Base_ptr local_21a8;
  undefined1 local_21a0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_2198;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_2190;
  _Base_ptr local_2168;
  undefined1 local_2160;
  _func_void_asmcode_ptr_compiler_options_ptr *local_2158;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_2150;
  _Base_ptr local_2128;
  undefined1 local_2120;
  _func_void_asmcode_ptr_compiler_options_ptr *local_2118;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_2110;
  _Base_ptr local_20e8;
  undefined1 local_20e0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_20d8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_20d0;
  _Base_ptr local_20a8;
  undefined1 local_20a0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_2098;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_2090;
  _Base_ptr local_2068;
  undefined1 local_2060;
  _func_void_asmcode_ptr_compiler_options_ptr *local_2058;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_2050;
  _Base_ptr local_2028;
  undefined1 local_2020;
  _func_void_asmcode_ptr_compiler_options_ptr *local_2018;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_2010;
  _Base_ptr local_1fe8;
  undefined1 local_1fe0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_1fd8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_1fd0;
  _Base_ptr local_1fa8;
  undefined1 local_1fa0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_1f98;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_1f90;
  _Base_ptr local_1f68;
  undefined1 local_1f60;
  _func_void_asmcode_ptr_compiler_options_ptr *local_1f58;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_1f50;
  _Base_ptr local_1f28;
  undefined1 local_1f20;
  _func_void_asmcode_ptr_compiler_options_ptr *local_1f18;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_1f10;
  _Base_ptr local_1ee8;
  undefined1 local_1ee0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_1ed8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_1ed0;
  _Base_ptr local_1ea8;
  undefined1 local_1ea0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_1e98;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_1e90;
  _Base_ptr local_1e68;
  undefined1 local_1e60;
  _func_void_asmcode_ptr_compiler_options_ptr *local_1e58;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_1e50;
  _Base_ptr local_1e28;
  undefined1 local_1e20;
  _func_void_asmcode_ptr_compiler_options_ptr *local_1e18;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_1e10;
  _Base_ptr local_1de8;
  undefined1 local_1de0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_1dd8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_1dd0;
  _Base_ptr local_1da8;
  undefined1 local_1da0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_1d98;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_1d90;
  _Base_ptr local_1d68;
  undefined1 local_1d60;
  _func_void_asmcode_ptr_compiler_options_ptr *local_1d58;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_1d50;
  _Base_ptr local_1d28;
  undefined1 local_1d20;
  _func_void_asmcode_ptr_compiler_options_ptr *local_1d18;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_1d10;
  _Base_ptr local_1ce8;
  undefined1 local_1ce0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_1cd8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_1cd0;
  _Base_ptr local_1ca8;
  undefined1 local_1ca0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_1c98;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_1c90;
  _Base_ptr local_1c68;
  undefined1 local_1c60;
  _func_void_asmcode_ptr_compiler_options_ptr *local_1c58;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_1c50;
  _Base_ptr local_1c28;
  undefined1 local_1c20;
  _func_void_asmcode_ptr_compiler_options_ptr *local_1c18;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_1c10;
  _Base_ptr local_1be8;
  undefined1 local_1be0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_1bd8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_1bd0;
  _Base_ptr local_1ba8;
  undefined1 local_1ba0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_1b98;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_1b90;
  _Base_ptr local_1b68;
  undefined1 local_1b60;
  _func_void_asmcode_ptr_compiler_options_ptr *local_1b58;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_1b50;
  _Base_ptr local_1b28;
  undefined1 local_1b20;
  _func_void_asmcode_ptr_compiler_options_ptr *local_1b18;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_1b10;
  _Base_ptr local_1ae8;
  undefined1 local_1ae0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_1ad8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_1ad0;
  _Base_ptr local_1aa8;
  undefined1 local_1aa0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_1a98;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_1a90;
  _Base_ptr local_1a68;
  undefined1 local_1a60;
  _func_void_asmcode_ptr_compiler_options_ptr *local_1a58;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_1a50;
  _Base_ptr local_1a28;
  undefined1 local_1a20;
  _func_void_asmcode_ptr_compiler_options_ptr *local_1a18;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_1a10;
  _Base_ptr local_19e8;
  undefined1 local_19e0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_19d8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_19d0;
  _Base_ptr local_19a8;
  undefined1 local_19a0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_1998;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_1990;
  _Base_ptr local_1968;
  undefined1 local_1960;
  _func_void_asmcode_ptr_compiler_options_ptr *local_1958;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_1950;
  _Base_ptr local_1928;
  undefined1 local_1920;
  _func_void_asmcode_ptr_compiler_options_ptr *local_1918;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_1910;
  _Base_ptr local_18e8;
  undefined1 local_18e0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_18d8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_18d0;
  _Base_ptr local_18a8;
  undefined1 local_18a0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_1898;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_1890;
  _Base_ptr local_1868;
  undefined1 local_1860;
  _func_void_asmcode_ptr_compiler_options_ptr *local_1858;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_1850;
  _Base_ptr local_1828;
  undefined1 local_1820;
  _func_void_asmcode_ptr_compiler_options_ptr *local_1818;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_1810;
  _Base_ptr local_17e8;
  undefined1 local_17e0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_17d8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_17d0;
  _Base_ptr local_17a8;
  undefined1 local_17a0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_1798;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_1790;
  _Base_ptr local_1768;
  undefined1 local_1760;
  _func_void_asmcode_ptr_compiler_options_ptr *local_1758;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_1750;
  _Base_ptr local_1728;
  undefined1 local_1720;
  _func_void_asmcode_ptr_compiler_options_ptr *local_1718;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_1710;
  _Base_ptr local_16e8;
  undefined1 local_16e0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_16d8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_16d0;
  _Base_ptr local_16a8;
  undefined1 local_16a0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_1698;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_1690;
  _Base_ptr local_1668;
  undefined1 local_1660;
  _func_void_asmcode_ptr_compiler_options_ptr *local_1658;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_1650;
  _Base_ptr local_1628;
  undefined1 local_1620;
  _func_void_asmcode_ptr_compiler_options_ptr *local_1618;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_1610;
  _Base_ptr local_15e8;
  undefined1 local_15e0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_15d8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_15d0;
  _Base_ptr local_15a8;
  undefined1 local_15a0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_1598;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_1590;
  _Base_ptr local_1568;
  undefined1 local_1560;
  _func_void_asmcode_ptr_compiler_options_ptr *local_1558;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_1550;
  _Base_ptr local_1528;
  undefined1 local_1520;
  _func_void_asmcode_ptr_compiler_options_ptr *local_1518;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_1510;
  _Base_ptr local_14e8;
  undefined1 local_14e0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_14d8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_14d0;
  _Base_ptr local_14a8;
  undefined1 local_14a0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_1498;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_1490;
  _Base_ptr local_1468;
  undefined1 local_1460;
  _func_void_asmcode_ptr_compiler_options_ptr *local_1458;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_1450;
  _Base_ptr local_1428;
  undefined1 local_1420;
  _func_void_asmcode_ptr_compiler_options_ptr *local_1418;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_1410;
  _Base_ptr local_13e8;
  undefined1 local_13e0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_13d8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_13d0;
  _Base_ptr local_13a8;
  undefined1 local_13a0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_1398;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_1390;
  _Base_ptr local_1368;
  undefined1 local_1360;
  _func_void_asmcode_ptr_compiler_options_ptr *local_1358;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_1350;
  _Base_ptr local_1328;
  undefined1 local_1320;
  _func_void_asmcode_ptr_compiler_options_ptr *local_1318;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_1310;
  _Base_ptr local_12e8;
  undefined1 local_12e0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_12d8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_12d0;
  _Base_ptr local_12a8;
  undefined1 local_12a0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_1298;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_1290;
  _Base_ptr local_1268;
  undefined1 local_1260;
  _func_void_asmcode_ptr_compiler_options_ptr *local_1258;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_1250;
  _Base_ptr local_1228;
  undefined1 local_1220;
  _func_void_asmcode_ptr_compiler_options_ptr *local_1218;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_1210;
  _Base_ptr local_11e8;
  undefined1 local_11e0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_11d8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_11d0;
  _Base_ptr local_11a8;
  undefined1 local_11a0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_1198;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_1190;
  _Base_ptr local_1168;
  undefined1 local_1160;
  _func_void_asmcode_ptr_compiler_options_ptr *local_1158;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_1150;
  _Base_ptr local_1128;
  undefined1 local_1120;
  _func_void_asmcode_ptr_compiler_options_ptr *local_1118;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_1110;
  _Base_ptr local_10e8;
  undefined1 local_10e0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_10d8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_10d0;
  _Base_ptr local_10a8;
  undefined1 local_10a0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_1098;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_1090;
  _Base_ptr local_1068;
  undefined1 local_1060;
  _func_void_asmcode_ptr_compiler_options_ptr *local_1058;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_1050;
  _Base_ptr local_1028;
  undefined1 local_1020;
  _func_void_asmcode_ptr_compiler_options_ptr *local_1018;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_1010;
  _Base_ptr local_fe8;
  undefined1 local_fe0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_fd8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_fd0;
  _Base_ptr local_fa8;
  undefined1 local_fa0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_f98;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_f90;
  _Base_ptr local_f68;
  undefined1 local_f60;
  _func_void_asmcode_ptr_compiler_options_ptr *local_f58;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_f50;
  _Base_ptr local_f28;
  undefined1 local_f20;
  _func_void_asmcode_ptr_compiler_options_ptr *local_f18;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_f10;
  _Base_ptr local_ee8;
  undefined1 local_ee0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_ed8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_ed0;
  _Base_ptr local_ea8;
  undefined1 local_ea0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_e98;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_e90;
  _Base_ptr local_e68;
  undefined1 local_e60;
  _func_void_asmcode_ptr_compiler_options_ptr *local_e58;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_e50;
  _Base_ptr local_e28;
  undefined1 local_e20;
  _func_void_asmcode_ptr_compiler_options_ptr *local_e18;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_e10;
  _Base_ptr local_de8;
  undefined1 local_de0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_dd8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_dd0;
  _Base_ptr local_da8;
  undefined1 local_da0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_d98;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_d90;
  _Base_ptr local_d68;
  undefined1 local_d60;
  _func_void_asmcode_ptr_compiler_options_ptr *local_d58;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_d50;
  _Base_ptr local_d28;
  undefined1 local_d20;
  _func_void_asmcode_ptr_compiler_options_ptr *local_d18;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_d10;
  _Base_ptr local_ce8;
  undefined1 local_ce0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_cd8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_cd0;
  _Base_ptr local_ca8;
  undefined1 local_ca0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_c98;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_c90;
  _Base_ptr local_c68;
  undefined1 local_c60;
  _func_void_asmcode_ptr_compiler_options_ptr *local_c58;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_c50;
  _Base_ptr local_c28;
  undefined1 local_c20;
  _func_void_asmcode_ptr_compiler_options_ptr *local_c18;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_c10;
  _Base_ptr local_be8;
  undefined1 local_be0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_bd8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_bd0;
  _Base_ptr local_ba8;
  undefined1 local_ba0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_b98;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_b90;
  _Base_ptr local_b68;
  undefined1 local_b60;
  _func_void_asmcode_ptr_compiler_options_ptr *local_b58;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_b50;
  _Base_ptr local_b28;
  undefined1 local_b20;
  _func_void_asmcode_ptr_compiler_options_ptr *local_b18;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_b10;
  _Base_ptr local_ae8;
  undefined1 local_ae0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_ad8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_ad0;
  _Base_ptr local_aa8;
  undefined1 local_aa0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_a98;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_a90;
  _Base_ptr local_a68;
  undefined1 local_a60;
  _func_void_asmcode_ptr_compiler_options_ptr *local_a58;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_a50;
  _Base_ptr local_a28;
  undefined1 local_a20;
  _func_void_asmcode_ptr_compiler_options_ptr *local_a18;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_a10;
  _Base_ptr local_9e8;
  undefined1 local_9e0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_9d8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_9d0;
  _Base_ptr local_9a8;
  undefined1 local_9a0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_998;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_990;
  _Base_ptr local_968;
  undefined1 local_960;
  _func_void_asmcode_ptr_compiler_options_ptr *local_958;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_950;
  _Base_ptr local_928;
  undefined1 local_920;
  _func_void_asmcode_ptr_compiler_options_ptr *local_918;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_910;
  _Base_ptr local_8e8;
  undefined1 local_8e0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_8d8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_8d0;
  _Base_ptr local_8a8;
  undefined1 local_8a0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_898;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_890;
  _Base_ptr local_868;
  undefined1 local_860;
  _func_void_asmcode_ptr_compiler_options_ptr *local_858;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_850;
  _Base_ptr local_828;
  undefined1 local_820;
  _func_void_asmcode_ptr_compiler_options_ptr *local_818;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_810;
  _Base_ptr local_7e8;
  undefined1 local_7e0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_7d8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_7d0;
  _Base_ptr local_7a8;
  undefined1 local_7a0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_798;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_790;
  _Base_ptr local_768;
  undefined1 local_760;
  _func_void_asmcode_ptr_compiler_options_ptr *local_758;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_750;
  _Base_ptr local_728;
  undefined1 local_720;
  _func_void_asmcode_ptr_compiler_options_ptr *local_718;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_710;
  _Base_ptr local_6e8;
  undefined1 local_6e0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_6d8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_6d0;
  _Base_ptr local_6a8;
  undefined1 local_6a0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_698;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_690;
  _Base_ptr local_668;
  undefined1 local_660;
  _func_void_asmcode_ptr_compiler_options_ptr *local_658;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_650;
  _Base_ptr local_628;
  undefined1 local_620;
  _func_void_asmcode_ptr_compiler_options_ptr *local_618;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_610;
  _Base_ptr local_5e8;
  undefined1 local_5e0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_5d8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_5d0;
  _Base_ptr local_5a8;
  undefined1 local_5a0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_598;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_590;
  _Base_ptr local_568;
  undefined1 local_560;
  _func_void_asmcode_ptr_compiler_options_ptr *local_558;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_550;
  _Base_ptr local_528;
  undefined1 local_520;
  _func_void_asmcode_ptr_compiler_options_ptr *local_518;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_510;
  _Base_ptr local_4e8;
  undefined1 local_4e0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_4d8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_4d0;
  _Base_ptr local_4a8;
  undefined1 local_4a0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_498;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_490;
  _Base_ptr local_468;
  undefined1 local_460;
  _func_void_asmcode_ptr_compiler_options_ptr *local_458;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_450;
  _Base_ptr local_428;
  undefined1 local_420;
  _func_void_asmcode_ptr_compiler_options_ptr *local_418;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_410;
  _Base_ptr local_3e8;
  undefined1 local_3e0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_3d8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_3d0;
  _Base_ptr local_3a8;
  undefined1 local_3a0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_398;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_390;
  _Base_ptr local_368;
  undefined1 local_360;
  _func_void_asmcode_ptr_compiler_options_ptr *local_358;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_350;
  _Base_ptr local_328;
  undefined1 local_320;
  _func_void_asmcode_ptr_compiler_options_ptr *local_318;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_310;
  _Base_ptr local_2e8;
  undefined1 local_2e0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_2d8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_2d0;
  _Base_ptr local_2a8;
  undefined1 local_2a0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_298;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_290;
  _Base_ptr local_268;
  undefined1 local_260;
  _func_void_asmcode_ptr_compiler_options_ptr *local_258;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_250;
  _Base_ptr local_228;
  undefined1 local_220;
  _func_void_asmcode_ptr_compiler_options_ptr *local_218;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_210;
  _Base_ptr local_1e8;
  undefined1 local_1e0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_1d8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_1d0;
  _Base_ptr local_1a8;
  undefined1 local_1a0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_198;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_190;
  _Base_ptr local_168;
  undefined1 local_160;
  _func_void_asmcode_ptr_compiler_options_ptr *local_158;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_150;
  _Base_ptr local_128;
  undefined1 local_120;
  _func_void_asmcode_ptr_compiler_options_ptr *local_118;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_110;
  _Base_ptr local_e8;
  undefined1 local_e0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_d8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_d0;
  _Base_ptr local_a8;
  undefined1 local_a0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_98;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_90;
  _Base_ptr local_68;
  undefined1 local_60;
  _func_void_asmcode_ptr_compiler_options_ptr *local_48;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_40;
  undefined1 local_11;
  function_map *fm;
  
  local_11 = 0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>_>_>
         *)in_RDI);
  local_48 = compile_add;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[2],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_40,(char (*) [2])0x4e0f63,&local_48);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_40);
  local_68 = (_Base_ptr)_Var1.first._M_node;
  local_60 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_40);
  local_98 = compile_sub;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[2],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_90,(char (*) [2])0x4e0f75,&local_98);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_90);
  local_a8 = (_Base_ptr)_Var1.first._M_node;
  local_a0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_90);
  local_d8 = compile_mul;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[2],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_d0,(char (*) [2])0x4e0f69,&local_d8);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_d0);
  local_e8 = (_Base_ptr)_Var1.first._M_node;
  local_e0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_d0);
  local_118 = compile_div;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[2],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_110,(char (*) [2])0x4e0f6f,&local_118);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_110);
  local_128 = (_Base_ptr)_Var1.first._M_node;
  local_120 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_110);
  local_158 = compile_equal;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[2],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_150,(char (*) [2])0x4e0925,&local_158);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_150);
  local_168 = (_Base_ptr)_Var1.first._M_node;
  local_160 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_150);
  local_198 = compile_not_equal;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[3],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_190,(char (*) [3])"!=",&local_198);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_190);
  local_1a8 = (_Base_ptr)_Var1.first._M_node;
  local_1a0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_190);
  local_1d8 = compile_less;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[2],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_1d0,(char (*) [2])"<",&local_1d8);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_1d0);
  local_1e8 = (_Base_ptr)_Var1.first._M_node;
  local_1e0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_1d0);
  local_218 = compile_leq;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[3],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_210,(char (*) [3])"<=",&local_218);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_210);
  local_228 = (_Base_ptr)_Var1.first._M_node;
  local_220 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_210);
  local_258 = compile_greater;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[2],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_250,(char (*) [2])0x4e7dfa,&local_258);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_250);
  local_268 = (_Base_ptr)_Var1.first._M_node;
  local_260 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_250);
  local_298 = compile_geq;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[3],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_290,(char (*) [3])">=",&local_298);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_290);
  local_2a8 = (_Base_ptr)_Var1.first._M_node;
  local_2a0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_290);
  local_2d8 = compile_allocate_symbol;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[17],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_2d0,(char (*) [17])"%allocate-symbol",&local_2d8);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_2d0);
  local_2e8 = (_Base_ptr)_Var1.first._M_node;
  local_2e0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_2d0);
  local_318 = compile_slot_ref;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[10],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_310,(char (*) [10])"%slot-ref",&local_318);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_310);
  local_328 = (_Base_ptr)_Var1.first._M_node;
  local_320 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_310);
  local_358 = compile_slot_set;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[11],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_350,(char (*) [11])"%slot-set!",&local_358);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_350);
  local_368 = (_Base_ptr)_Var1.first._M_node;
  local_360 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_350);
  local_398 = compile_undefined;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[11],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_390,(char (*) [11])0x4e0c11,&local_398);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_390);
  local_3a8 = (_Base_ptr)_Var1.first._M_node;
  local_3a0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_390);
  local_3d8 = compile_skiwi_quiet_undefined;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[17],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_3d0,(char (*) [17])0x4e0c1e,&local_3d8);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_3d0);
  local_3e8 = (_Base_ptr)_Var1.first._M_node;
  local_3e0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_3d0);
  local_418 = compile_add1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[5],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_410,(char (*) [5])0x4e0f37,&local_418);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_410);
  local_428 = (_Base_ptr)_Var1.first._M_node;
  local_420 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_410);
  local_458 = compile_apply;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[7],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_450,(char (*) [7])"%apply",&local_458);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_450);
  local_468 = (_Base_ptr)_Var1.first._M_node;
  local_460 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_450);
  local_498 = compile_arithmetic_shift;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[17],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_490,(char (*) [17])0x4e0bfe,&local_498);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_490);
  local_4a8 = (_Base_ptr)_Var1.first._M_node;
  local_4a0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_490);
  local_4d8 = compile_assoc;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[6],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_4d0,(char (*) [6])"assoc",&local_4d8);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_4d0);
  local_4e8 = (_Base_ptr)_Var1.first._M_node;
  local_4e0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_4d0);
  local_518 = compile_assq;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[5],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_510,(char (*) [5])0x4e0e88,&local_518);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_510);
  local_528 = (_Base_ptr)_Var1.first._M_node;
  local_520 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_510);
  local_558 = compile_assv;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[5],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_550,(char (*) [5])"assv",&local_558);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_550);
  local_568 = (_Base_ptr)_Var1.first._M_node;
  local_560 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_550);
  local_598 = compile_bitwise_and;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[12],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_590,(char (*) [12])0x4e0cb0,&local_598);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_590);
  local_5a8 = (_Base_ptr)_Var1.first._M_node;
  local_5a0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_590);
  local_5d8 = compile_bitwise_not;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[12],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_5d0,(char (*) [12])0x4e0cbe,&local_5d8);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_5d0);
  local_5e8 = (_Base_ptr)_Var1.first._M_node;
  local_5e0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_5d0);
  local_618 = compile_bitwise_or;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[11],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_610,(char (*) [11])0x4e0ccc,&local_618);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_610);
  local_628 = (_Base_ptr)_Var1.first._M_node;
  local_620 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_610);
  local_658 = compile_bitwise_xor;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[12],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_650,(char (*) [12])0x4e0cd9,&local_658);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_650);
  local_668 = (_Base_ptr)_Var1.first._M_node;
  local_660 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_650);
  local_698 = compile_is_boolean;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[9],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_690,(char (*) [9])0x4e0ff8,&local_698);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_690);
  local_6a8 = (_Base_ptr)_Var1.first._M_node;
  local_6a0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_690);
  local_6d8 = compile_car;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[4],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_6d0,(char (*) [4])0x4e0e9c,&local_6d8);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_6d0);
  local_6e8 = (_Base_ptr)_Var1.first._M_node;
  local_6e0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_6d0);
  local_718 = compile_cdr;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[4],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_710,(char (*) [4])0x4e0ea2,&local_718);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_710);
  local_728 = (_Base_ptr)_Var1.first._M_node;
  local_720 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_710);
  local_758 = compile_is_char;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[6],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_750,(char (*) [6])0x4e1019,&local_758);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_750);
  local_768 = (_Base_ptr)_Var1.first._M_node;
  local_760 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_750);
  local_798 = compile_char_equal;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[7],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_790,(char (*) [7])0x4e0ca7,&local_798);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_790);
  local_7a8 = (_Base_ptr)_Var1.first._M_node;
  local_7a0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_790);
  local_7d8 = compile_char_less;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[7],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_7d0,(char (*) [7])0x4e0c81,&local_7d8);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_7d0);
  local_7e8 = (_Base_ptr)_Var1.first._M_node;
  local_7e0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_7d0);
  local_818 = compile_char_greater;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[7],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_810,(char (*) [7])0x4e0c94,&local_818);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_810);
  local_828 = (_Base_ptr)_Var1.first._M_node;
  local_820 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_810);
  local_858 = compile_char_leq;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[8],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_850,(char (*) [8])0x4e0c8a,&local_858);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_850);
  local_868 = (_Base_ptr)_Var1.first._M_node;
  local_860 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_850);
  local_898 = compile_char_geq;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[8],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_890,(char (*) [8])0x4e0c9d,&local_898);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_890);
  local_8a8 = (_Base_ptr)_Var1.first._M_node;
  local_8a0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_890);
  local_8d8 = compile_char_to_fixnum;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[13],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_8d0,(char (*) [13])0x4e0c72,&local_8d8);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_8d0);
  local_8e8 = (_Base_ptr)_Var1.first._M_node;
  local_8e0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_8d0);
  local_918 = compile_close_file;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[11],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_910,(char (*) [11])"close-file",&local_918);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_910);
  local_928 = (_Base_ptr)_Var1.first._M_node;
  local_920 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_910);
  local_958 = compile_closure;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[8],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_950,(char (*) [8])"closure",&local_958);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_950);
  local_968 = (_Base_ptr)_Var1.first._M_node;
  local_960 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_950);
  local_998 = compile_is_closure;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[9],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_990,(char (*) [9])0x4e0fe0,&local_998);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_990);
  local_9a8 = (_Base_ptr)_Var1.first._M_node;
  local_9a0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_990);
  local_9d8 = compile_closure_ref;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[12],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_9d0,(char (*) [12])"closure-ref",&local_9d8);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_9d0);
  local_9e8 = (_Base_ptr)_Var1.first._M_node;
  local_9e0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_9d0);
  local_a18 = compile_cons;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[5],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_a10,(char (*) [5])0x4e0e95,&local_a18);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_a10);
  local_a28 = (_Base_ptr)_Var1.first._M_node;
  local_a20 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_a10);
  local_a58 = compile_compare_strings;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[16],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_a50,(char (*) [16])"compare-strings",&local_a58);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_a50);
  local_a68 = (_Base_ptr)_Var1.first._M_node;
  local_a60 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_a50);
  local_a98 = compile_compare_strings_ci;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[19],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_a90,(char (*) [19])"compare-strings-ci",&local_a98);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_a90);
  local_aa8 = (_Base_ptr)_Var1.first._M_node;
  local_aa0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_a90);
  local_ad8 = compile_current_seconds;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[16],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_ad0,(char (*) [16])"current-seconds",&local_ad8);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_ad0);
  local_ae8 = (_Base_ptr)_Var1.first._M_node;
  local_ae0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_ad0);
  local_b18 = compile_current_milliseconds;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[21],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_b10,(char (*) [21])"current-milliseconds",&local_b18);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_b10);
  local_b28 = (_Base_ptr)_Var1.first._M_node;
  local_b20 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_b10);
  local_b58 = compile_is_eof_object;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[12],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_b50,(char (*) [12])0x4e100b,&local_b58);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_b50);
  local_b68 = (_Base_ptr)_Var1.first._M_node;
  local_b60 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_b50);
  local_b98 = compile_is_eq;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[4],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_b90,(char (*) [4])0x4e0ebe,&local_b98);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_b90);
  local_ba8 = (_Base_ptr)_Var1.first._M_node;
  local_ba0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_b90);
  local_bd8 = compile_is_eqv;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[5],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_bd0,(char (*) [5])0x4e09bb,&local_bd8);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_bd0);
  local_be8 = (_Base_ptr)_Var1.first._M_node;
  local_be0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_bd0);
  local_c18 = compile_is_eqv_structurally;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[6],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_c10,(char (*) [6])"%eqv?",&local_c18);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_c10);
  local_c28 = (_Base_ptr)_Var1.first._M_node;
  local_c20 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_c10);
  local_c58 = compile_is_equal;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[7],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_c50,(char (*) [7])"equal?",&local_c58);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_c50);
  local_c68 = (_Base_ptr)_Var1.first._M_node;
  local_c60 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_c50);
  local_c98 = compile_error;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[7],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_c90,(char (*) [7])"%error",&local_c98);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_c90);
  local_ca8 = (_Base_ptr)_Var1.first._M_node;
  local_ca0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_c90);
  local_cd8 = compile_eval;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[6],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_cd0,(char (*) [6])"%eval",&local_cd8);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_cd0);
  local_ce8 = (_Base_ptr)_Var1.first._M_node;
  local_ce0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_cd0);
  local_d18 = compile_file_exists;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[13],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_d10,(char (*) [13])"file-exists?",&local_d18);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_d10);
  local_d28 = (_Base_ptr)_Var1.first._M_node;
  local_d20 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_d10);
  local_d58 = compile_is_fixnum;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[8],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_d50,(char (*) [8])0x4e0fa6,&local_d58);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_d50);
  local_d68 = (_Base_ptr)_Var1.first._M_node;
  local_d60 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_d50);
  local_d98 = compile_fixnum_to_char;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[13],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_d90,(char (*) [13])0x4e0c63,&local_d98);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_d90);
  local_da8 = (_Base_ptr)_Var1.first._M_node;
  local_da0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_d90);
  local_dd8 = compile_fixnum_to_flonum;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[15],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_dd0,(char (*) [15])0x4e0c41,&local_dd8);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_dd0);
  local_de8 = (_Base_ptr)_Var1.first._M_node;
  local_de0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_dd0);
  local_e18 = compile_fixnum_expt;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[12],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_e10,(char (*) [12])"fixnum-expt",&local_e18);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_e10);
  local_e28 = (_Base_ptr)_Var1.first._M_node;
  local_e20 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_e10);
  local_e58 = compile_is_flonum;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[8],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_e50,(char (*) [8])0x4e0fb0,&local_e58);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_e50);
  local_e68 = (_Base_ptr)_Var1.first._M_node;
  local_e60 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_e50);
  local_e98 = compile_flonum_to_fixnum;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[15],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_e90,(char (*) [15])0x4e0c52,&local_e98);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_e90);
  local_ea8 = (_Base_ptr)_Var1.first._M_node;
  local_ea0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_e90);
  local_ed8 = compile_flonum_expt;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[12],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_ed0,(char (*) [12])"flonum-expt",&local_ed8);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_ed0);
  local_ee8 = (_Base_ptr)_Var1.first._M_node;
  local_ee0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_ed0);
  local_f18 = compile_flush_output_port;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[19],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_f10,(char (*) [19])"%flush-output-port",&local_f18);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_f10);
  local_f28 = (_Base_ptr)_Var1.first._M_node;
  local_f20 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_f10);
  local_f58 = compile_fx_equal;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[5],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_f50,(char (*) [5])0x4e0f26,&local_f58);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_f50);
  local_f68 = (_Base_ptr)_Var1.first._M_node;
  local_f60 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_f50);
  local_f98 = compile_fx_less;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[5],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_f90,(char (*) [5])0x4e0f08,&local_f98);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_f90);
  local_fa8 = (_Base_ptr)_Var1.first._M_node;
  local_fa0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_f90);
  local_fd8 = compile_fx_greater;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[5],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_fd0,(char (*) [5])0x4e0f17,&local_fd8);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_fd0);
  local_fe8 = (_Base_ptr)_Var1.first._M_node;
  local_fe0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_fd0);
  local_1018 = compile_fx_leq;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[6],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_1010,(char (*) [6])0x4e0f0f,&local_1018);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_1010);
  local_1028 = (_Base_ptr)_Var1.first._M_node;
  local_1020 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_1010);
  local_1058 = compile_fx_geq;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[6],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_1050,(char (*) [6])0x4e0f1e,&local_1058);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_1050);
  local_1068 = (_Base_ptr)_Var1.first._M_node;
  local_1060 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_1050);
  local_1098 = compile_fx_add;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[4],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_1090,(char (*) [4])0x4e0ef0,&local_1098);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_1090);
  local_10a8 = (_Base_ptr)_Var1.first._M_node;
  local_10a0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_1090);
  local_10d8 = compile_fx_sub;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[4],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_10d0,(char (*) [4])0x4e0ef6,&local_10d8);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_10d0);
  local_10e8 = (_Base_ptr)_Var1.first._M_node;
  local_10e0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_10d0);
  local_1118 = compile_fx_mul;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[4],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_1110,(char (*) [4])0x4e0efc,&local_1118);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_1110);
  local_1128 = (_Base_ptr)_Var1.first._M_node;
  local_1120 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_1110);
  local_1158 = compile_fx_div;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[4],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_1150,(char (*) [4])0x4e0f02,&local_1158);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_1150);
  local_1168 = (_Base_ptr)_Var1.first._M_node;
  local_1160 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_1150);
  local_1198 = compile_fx_add1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[7],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_1190,(char (*) [7])0x4e0ec4,&local_1198);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_1190);
  local_11a8 = (_Base_ptr)_Var1.first._M_node;
  local_11a0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_1190);
  local_11d8 = compile_fx_sub1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[7],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_11d0,(char (*) [7])0x4e0ecd,&local_11d8);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_11d0);
  local_11e8 = (_Base_ptr)_Var1.first._M_node;
  local_11e0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_11d0);
  local_1218 = compile_fx_is_zero;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[8],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_1210,(char (*) [8])0x4e0ee6,&local_1218);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_1210);
  local_1228 = (_Base_ptr)_Var1.first._M_node;
  local_1220 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_1210);
  local_1258 = compile_getenv;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[7],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_1250,(char (*) [7])0x4eaebd,&local_1258);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_1250);
  local_1268 = (_Base_ptr)_Var1.first._M_node;
  local_1260 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_1250);
  local_1298 = compile_halt;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[5],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_1290,(char (*) [5])"halt",&local_1298);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_1290);
  local_12a8 = (_Base_ptr)_Var1.first._M_node;
  local_12a0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_1290);
  local_12d8 = compile_ieee754_sign;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[13],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_12d0,(char (*) [13])0x4e0ce7,&local_12d8);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_12d0);
  local_12e8 = (_Base_ptr)_Var1.first._M_node;
  local_12e0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_12d0);
  local_1318 = compile_ieee754_exponent;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[17],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_1310,(char (*) [17])0x4e0d09,&local_1318);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_1310);
  local_1328 = (_Base_ptr)_Var1.first._M_node;
  local_1320 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_1310);
  local_1358 = compile_ieee754_mantissa;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[17],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_1350,(char (*) [17])0x4e0cf6,&local_1358);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_1350);
  local_1368 = (_Base_ptr)_Var1.first._M_node;
  local_1360 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_1350);
  local_1398 = compile_ieee754_sin;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[12],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_1390,(char (*) [12])"ieee754-sin",&local_1398);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_1390);
  local_13a8 = (_Base_ptr)_Var1.first._M_node;
  local_13a0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_1390);
  local_13d8 = compile_ieee754_cos;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[12],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_13d0,(char (*) [12])"ieee754-cos",&local_13d8);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_13d0);
  local_13e8 = (_Base_ptr)_Var1.first._M_node;
  local_13e0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_13d0);
  local_1418 = compile_ieee754_tan;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[12],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_1410,(char (*) [12])"ieee754-tan",&local_1418);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_1410);
  local_1428 = (_Base_ptr)_Var1.first._M_node;
  local_1420 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_1410);
  local_1458 = compile_ieee754_asin;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[13],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_1450,(char (*) [13])"ieee754-asin",&local_1458);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_1450);
  local_1468 = (_Base_ptr)_Var1.first._M_node;
  local_1460 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_1450);
  local_1498 = compile_ieee754_acos;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[13],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_1490,(char (*) [13])"ieee754-acos",&local_1498);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_1490);
  local_14a8 = (_Base_ptr)_Var1.first._M_node;
  local_14a0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_1490);
  local_14d8 = compile_ieee754_atan1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[14],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_14d0,(char (*) [14])"ieee754-atan1",&local_14d8);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_14d0);
  local_14e8 = (_Base_ptr)_Var1.first._M_node;
  local_14e0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_14d0);
  local_1518 = compile_ieee754_log;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[12],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_1510,(char (*) [12])"ieee754-log",&local_1518);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_1510);
  local_1528 = (_Base_ptr)_Var1.first._M_node;
  local_1520 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_1510);
  local_1558 = compile_ieee754_round;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[14],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_1550,(char (*) [14])"ieee754-round",&local_1558);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_1550);
  local_1568 = (_Base_ptr)_Var1.first._M_node;
  local_1560 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_1550);
  local_1598 = compile_ieee754_sqrt;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[13],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_1590,(char (*) [13])"ieee754-sqrt",&local_1598);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_1590);
  local_15a8 = (_Base_ptr)_Var1.first._M_node;
  local_15a0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_1590);
  local_15d8 = compile_ieee754_truncate;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[17],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_15d0,(char (*) [17])"ieee754-truncate",&local_15d8);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_15d0);
  local_15e8 = (_Base_ptr)_Var1.first._M_node;
  local_15e0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_15d0);
  local_1618 = compile_ieee754_pi;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[11],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_1610,(char (*) [11])0x4e0d1c,&local_1618);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_1610);
  local_1628 = (_Base_ptr)_Var1.first._M_node;
  local_1620 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_1610);
  local_1658 = compile_is_input_port;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[12],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_1650,(char (*) [12])0x4e1034,&local_1658);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_1650);
  local_1668 = (_Base_ptr)_Var1.first._M_node;
  local_1660 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_1650);
  local_1698 = compile_load;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[5],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_1690,(char (*) [5])0x4e6e5e,&local_1698);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_1690);
  local_16a8 = (_Base_ptr)_Var1.first._M_node;
  local_16a0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_1690);
  local_16d8 = compile_length;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[7],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_16d0,(char (*) [7])0x4e0b44,&local_16d8);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_16d0);
  local_16e8 = (_Base_ptr)_Var1.first._M_node;
  local_16e0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_16d0);
  local_1718 = compile_list;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[5],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_1710,(char (*) [5])0x4e6d9e,&local_1718);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_1710);
  local_1728 = (_Base_ptr)_Var1.first._M_node;
  local_1720 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_1710);
  local_1758 = compile_make_port;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[10],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_1750,(char (*) [10])"make-port",&local_1758);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_1750);
  local_1768 = (_Base_ptr)_Var1.first._M_node;
  local_1760 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_1750);
  local_1798 = compile_make_promise;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[14],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_1790,(char (*) [14])"%make-promise",&local_1798);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_1790);
  local_17a8 = (_Base_ptr)_Var1.first._M_node;
  local_17a0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_1790);
  local_17d8 = compile_make_string;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[12],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_17d0,(char (*) [12])"make-string",&local_17d8);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_17d0);
  local_17e8 = (_Base_ptr)_Var1.first._M_node;
  local_17e0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_17d0);
  local_1818 = compile_make_vector;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[12],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_1810,(char (*) [12])"make-vector",&local_1818);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_1810);
  local_1828 = (_Base_ptr)_Var1.first._M_node;
  local_1820 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_1810);
  local_1858 = compile_max;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[4],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_1850,(char (*) [4])0x4e0f49,&local_1858);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_1850);
  local_1868 = (_Base_ptr)_Var1.first._M_node;
  local_1860 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_1850);
  local_1898 = compile_member;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[7],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_1890,(char (*) [7])"member",&local_1898);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_1890);
  local_18a8 = (_Base_ptr)_Var1.first._M_node;
  local_18a0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_1890);
  local_18d8 = compile_memq;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[5],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_18d0,(char (*) [5])0x4e0e81,&local_18d8);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_18d0);
  local_18e8 = (_Base_ptr)_Var1.first._M_node;
  local_18e0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_18d0);
  local_1918 = compile_memv;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[5],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_1910,(char (*) [5])"memv",&local_1918);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_1910);
  local_1928 = (_Base_ptr)_Var1.first._M_node;
  local_1920 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_1910);
  local_1958 = compile_min;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[4],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_1950,(char (*) [4])0x4e0f51,&local_1958);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_1950);
  local_1968 = (_Base_ptr)_Var1.first._M_node;
  local_1960 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_1950);
  local_1998 = compile_not;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[4],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_1990,(char (*) [4])0x4e0e8f,&local_1998);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_1990);
  local_19a8 = (_Base_ptr)_Var1.first._M_node;
  local_19a0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_1990);
  local_19d8 = compile_is_nil;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[6],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_19d0,(char (*) [6])0x4e1003,&local_19d8);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_19d0);
  local_19e8 = (_Base_ptr)_Var1.first._M_node;
  local_19e0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_19d0);
  local_1a18 = compile_num2str;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[8],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_1a10,(char (*) [8])"num2str",&local_1a18);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_1a10);
  local_1a28 = (_Base_ptr)_Var1.first._M_node;
  local_1a20 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_1a10);
  local_1a58 = compile_open_file;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[10],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_1a50,(char (*) [10])"open-file",&local_1a58);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_1a50);
  local_1a68 = (_Base_ptr)_Var1.first._M_node;
  local_1a60 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_1a50);
  local_1a98 = compile_is_output_port;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[13],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_1a90,(char (*) [13])0x4e1042,&local_1a98);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_1a90);
  local_1aa8 = (_Base_ptr)_Var1.first._M_node;
  local_1aa0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_1a90);
  local_1ad8 = compile_peek_char;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[11],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_1ad0,(char (*) [11])"%peek-char",&local_1ad8);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_1ad0);
  local_1ae8 = (_Base_ptr)_Var1.first._M_node;
  local_1ae0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_1ad0);
  local_1b18 = compile_is_pair;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[6],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_1b10,(char (*) [6])0x4e0fba,&local_1b18);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_1b10);
  local_1b28 = (_Base_ptr)_Var1.first._M_node;
  local_1b20 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_1b10);
  local_1b58 = compile_is_port;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[6],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_1b50,(char (*) [6])0x4e102c,&local_1b58);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_1b50);
  local_1b68 = (_Base_ptr)_Var1.first._M_node;
  local_1b60 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_1b50);
  local_1b98 = compile_is_procedure;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[11],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_1b90,(char (*) [11])0x4e0feb,&local_1b98);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_1b90);
  local_1ba8 = (_Base_ptr)_Var1.first._M_node;
  local_1ba0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_1b90);
  local_1bd8 = compile_is_promise;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[9],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_1bd0,(char (*) [9])0x4e1021,&local_1bd8);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_1bd0);
  local_1be8 = (_Base_ptr)_Var1.first._M_node;
  local_1be0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_1bd0);
  local_1c18 = compile_putenv;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[7],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_1c10,(char (*) [7])0x4eaecb,&local_1c18);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_1c10);
  local_1c28 = (_Base_ptr)_Var1.first._M_node;
  local_1c20 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_1c10);
  local_1c58 = compile_quotient;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[9],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_1c50,(char (*) [9])0x4e0bf3,&local_1c58);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_1c50);
  local_1c68 = (_Base_ptr)_Var1.first._M_node;
  local_1c60 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_1c50);
  local_1c98 = compile_read_char;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[11],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_1c90,(char (*) [11])"%read-char",&local_1c98);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_1c90);
  local_1ca8 = (_Base_ptr)_Var1.first._M_node;
  local_1ca0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_1c90);
  local_1cd8 = compile_reclaim;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[8],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_1cd0,(char (*) [8])"reclaim",&local_1cd8);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_1cd0);
  local_1ce8 = (_Base_ptr)_Var1.first._M_node;
  local_1ce0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_1cd0);
  local_1d18 = compile_reclaim_garbage;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[16],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_1d10,(char (*) [16])0x4e1b0d,&local_1d18);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_1d10);
  local_1d28 = (_Base_ptr)_Var1.first._M_node;
  local_1d20 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_1d10);
  local_1d58 = compile_remainder;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[10],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_1d50,(char (*) [10])0x4e0be7,&local_1d58);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_1d50);
  local_1d68 = (_Base_ptr)_Var1.first._M_node;
  local_1d60 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_1d50);
  local_1d98 = compile_set_car;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[9],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_1d90,(char (*) [9])0x4e0ea8,&local_1d98);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_1d90);
  local_1da8 = (_Base_ptr)_Var1.first._M_node;
  local_1da0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_1d90);
  local_1dd8 = compile_set_cdr;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[9],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_1dd0,(char (*) [9])0x4e0eb3,&local_1dd8);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_1dd0);
  local_1de8 = (_Base_ptr)_Var1.first._M_node;
  local_1de0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_1dd0);
  local_1e18 = compile_str2num;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[8],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_1e10,(char (*) [8])"str2num",&local_1e18);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_1e10);
  local_1e28 = (_Base_ptr)_Var1.first._M_node;
  local_1e20 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_1e10);
  local_1e58 = compile_string;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[7],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_1e50,(char (*) [7])0x4e6d52,&local_1e58);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_1e50);
  local_1e68 = (_Base_ptr)_Var1.first._M_node;
  local_1e60 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_1e50);
  local_1e98 = compile_string_hash;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[12],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_1e90,(char (*) [12])"string-hash",&local_1e98);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_1e90);
  local_1ea8 = (_Base_ptr)_Var1.first._M_node;
  local_1ea0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_1e90);
  local_1ed8 = compile_is_string;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[8],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_1ed0,(char (*) [8])0x4e0fcc,&local_1ed8);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_1ed0);
  local_1ee8 = (_Base_ptr)_Var1.first._M_node;
  local_1ee0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_1ed0);
  local_1f18 = compile_string_append1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[15],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_1f10,(char (*) [15])"string-append1",&local_1f18);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_1f10);
  local_1f28 = (_Base_ptr)_Var1.first._M_node;
  local_1f20 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_1f10);
  local_1f58 = compile_string_copy;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[12],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_1f50,(char (*) [12])"string-copy",&local_1f58);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_1f50);
  local_1f68 = (_Base_ptr)_Var1.first._M_node;
  local_1f60 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_1f50);
  local_1f98 = compile_string_fill;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[13],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_1f90,(char (*) [13])"string-fill!",&local_1f98);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_1f90);
  local_1fa8 = (_Base_ptr)_Var1.first._M_node;
  local_1fa0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_1f90);
  local_1fd8 = compile_string_length;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[14],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_1fd0,(char (*) [14])"string-length",&local_1fd8);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_1fd0);
  local_1fe8 = (_Base_ptr)_Var1.first._M_node;
  local_1fe0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_1fd0);
  local_2018 = compile_string_ref;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[11],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_2010,(char (*) [11])"string-ref",&local_2018);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_2010);
  local_2028 = (_Base_ptr)_Var1.first._M_node;
  local_2020 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_2010);
  local_2058 = compile_string_set;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[12],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_2050,(char (*) [12])"string-set!",&local_2058);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_2050);
  local_2068 = (_Base_ptr)_Var1.first._M_node;
  local_2060 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_2050);
  local_2098 = compile_substring;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[10],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_2090,(char (*) [10])"substring",&local_2098);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_2090);
  local_20a8 = (_Base_ptr)_Var1.first._M_node;
  local_20a0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_2090);
  local_20d8 = compile_symbol_to_string;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[15],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_20d0,(char (*) [15])"symbol->string",&local_20d8);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_20d0);
  local_20e8 = (_Base_ptr)_Var1.first._M_node;
  local_20e0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_20d0);
  local_2118 = compile_is_symbol;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[8],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_2110,(char (*) [8])0x4e0fd6,&local_2118);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_2110);
  local_2128 = (_Base_ptr)_Var1.first._M_node;
  local_2120 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_2110);
  local_2158 = compile_sub1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[5],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_2150,(char (*) [5])0x4e0f40,&local_2158);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_2150);
  local_2168 = (_Base_ptr)_Var1.first._M_node;
  local_2160 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_2150);
  local_2198 = compile_vector;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[7],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_2190,(char (*) [7])0x4e6d6c,&local_2198);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_2190);
  local_21a8 = (_Base_ptr)_Var1.first._M_node;
  local_21a0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_2190);
  local_21d8 = compile_is_vector;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[8],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_21d0,(char (*) [8])0x4e0fc2,&local_21d8);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_21d0);
  local_21e8 = (_Base_ptr)_Var1.first._M_node;
  local_21e0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_21d0);
  local_2218 = compile_vector_fill;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[13],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_2210,(char (*) [13])"vector-fill!",&local_2218);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_2210);
  local_2228 = (_Base_ptr)_Var1.first._M_node;
  local_2220 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_2210);
  local_2258 = compile_vector_length;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[14],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_2250,(char (*) [14])0x4e0c31,&local_2258);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_2250);
  local_2268 = (_Base_ptr)_Var1.first._M_node;
  local_2260 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_2250);
  local_2298 = compile_vector_ref;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[11],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_2290,(char (*) [11])"vector-ref",&local_2298);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_2290);
  local_22a8 = (_Base_ptr)_Var1.first._M_node;
  local_22a0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_2290);
  local_22d8 = compile_vector_set;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[12],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_22d0,(char (*) [12])"vector-set!",&local_22d8);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_22d0);
  local_22e8 = (_Base_ptr)_Var1.first._M_node;
  local_22e0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_22d0);
  local_2318 = compile_write_char;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[12],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_2310,(char (*) [12])"%write-char",&local_2318);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_2310);
  local_2328 = (_Base_ptr)_Var1.first._M_node;
  local_2320 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_2310);
  local_2358 = compile_write_string;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[14],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_2350,(char (*) [14])"%write-string",&local_2358);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_2350);
  local_2368 = (_Base_ptr)_Var1.first._M_node;
  local_2360 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_2350);
  local_2398 = compile_is_zero;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[6],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_2390,(char (*) [6])0x4e0f59,&local_2398);
  std::
  map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_2390);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_2390);
  return (function_map *)in_RDI;
}

Assistant:

function_map generate_function_map()
  {
  function_map fm;
  fm.insert(std::pair<std::string, fun_ptr>("+", &compile_add));
  fm.insert(std::pair<std::string, fun_ptr>("-", &compile_sub));
  fm.insert(std::pair<std::string, fun_ptr>("*", &compile_mul));
  fm.insert(std::pair<std::string, fun_ptr>("/", &compile_div));
  fm.insert(std::pair<std::string, fun_ptr>("=", &compile_equal));
  fm.insert(std::pair<std::string, fun_ptr>("!=", &compile_not_equal));
  fm.insert(std::pair<std::string, fun_ptr>("<", &compile_less));
  fm.insert(std::pair<std::string, fun_ptr>("<=", &compile_leq));
  fm.insert(std::pair<std::string, fun_ptr>(">", &compile_greater));
  fm.insert(std::pair<std::string, fun_ptr>(">=", &compile_geq));
  fm.insert(std::pair<std::string, fun_ptr>("%allocate-symbol", &compile_allocate_symbol));
  fm.insert(std::pair<std::string, fun_ptr>("%slot-ref", &compile_slot_ref));
  fm.insert(std::pair<std::string, fun_ptr>("%slot-set!", &compile_slot_set));
  fm.insert(std::pair<std::string, fun_ptr>("%undefined", &compile_undefined));
  fm.insert(std::pair<std::string, fun_ptr>("%quiet-undefined", &compile_skiwi_quiet_undefined));
  fm.insert(std::pair<std::string, fun_ptr>("add1", &compile_add1));
  fm.insert(std::pair<std::string, fun_ptr>("%apply", &compile_apply));
  fm.insert(std::pair<std::string, fun_ptr>("arithmetic-shift", &compile_arithmetic_shift));
  fm.insert(std::pair<std::string, fun_ptr>("assoc", &compile_assoc));
  fm.insert(std::pair<std::string, fun_ptr>("assq", &compile_assq));
  fm.insert(std::pair<std::string, fun_ptr>("assv", &compile_assv));
  fm.insert(std::pair<std::string, fun_ptr>("bitwise-and", &compile_bitwise_and));
  fm.insert(std::pair<std::string, fun_ptr>("bitwise-not", &compile_bitwise_not));
  fm.insert(std::pair<std::string, fun_ptr>("bitwise-or", &compile_bitwise_or));
  fm.insert(std::pair<std::string, fun_ptr>("bitwise-xor", &compile_bitwise_xor));
  fm.insert(std::pair<std::string, fun_ptr>("boolean?", &compile_is_boolean));
  fm.insert(std::pair<std::string, fun_ptr>("car", &compile_car));
  fm.insert(std::pair<std::string, fun_ptr>("cdr", &compile_cdr));
  fm.insert(std::pair<std::string, fun_ptr>("char?", &compile_is_char));
  fm.insert(std::pair<std::string, fun_ptr>("char=?", &compile_char_equal));
  fm.insert(std::pair<std::string, fun_ptr>("char<?", &compile_char_less));
  fm.insert(std::pair<std::string, fun_ptr>("char>?", &compile_char_greater));
  fm.insert(std::pair<std::string, fun_ptr>("char<=?", &compile_char_leq));
  fm.insert(std::pair<std::string, fun_ptr>("char>=?", &compile_char_geq));
  fm.insert(std::pair<std::string, fun_ptr>("char->fixnum", &compile_char_to_fixnum));
  fm.insert(std::pair<std::string, fun_ptr>("close-file", &compile_close_file));
  fm.insert(std::pair<std::string, fun_ptr>("closure", &compile_closure));
  fm.insert(std::pair<std::string, fun_ptr>("closure?", &compile_is_closure));
  fm.insert(std::pair<std::string, fun_ptr>("closure-ref", &compile_closure_ref));
  fm.insert(std::pair<std::string, fun_ptr>("cons", &compile_cons));
  fm.insert(std::pair<std::string, fun_ptr>("compare-strings", &compile_compare_strings));
  fm.insert(std::pair<std::string, fun_ptr>("compare-strings-ci", &compile_compare_strings_ci));
  fm.insert(std::pair<std::string, fun_ptr>("current-seconds", &compile_current_seconds));
  fm.insert(std::pair<std::string, fun_ptr>("current-milliseconds", &compile_current_milliseconds));
  fm.insert(std::pair<std::string, fun_ptr>("eof-object?", &compile_is_eof_object));
  fm.insert(std::pair<std::string, fun_ptr>("eq?", &compile_is_eq));
  fm.insert(std::pair<std::string, fun_ptr>("eqv?", &compile_is_eqv));
  fm.insert(std::pair<std::string, fun_ptr>("%eqv?", &compile_is_eqv_structurally));
  fm.insert(std::pair<std::string, fun_ptr>("equal?", &compile_is_equal));
  fm.insert(std::pair<std::string, fun_ptr>("%error", &compile_error));
  fm.insert(std::pair<std::string, fun_ptr>("%eval", &compile_eval));
  fm.insert(std::pair<std::string, fun_ptr>("file-exists?", &compile_file_exists));
  fm.insert(std::pair<std::string, fun_ptr>("fixnum?", &compile_is_fixnum));
  fm.insert(std::pair<std::string, fun_ptr>("fixnum->char", &compile_fixnum_to_char));
  fm.insert(std::pair<std::string, fun_ptr>("fixnum->flonum", &compile_fixnum_to_flonum));
  fm.insert(std::pair<std::string, fun_ptr>("fixnum-expt", &compile_fixnum_expt));
  fm.insert(std::pair<std::string, fun_ptr>("flonum?", &compile_is_flonum));
  fm.insert(std::pair<std::string, fun_ptr>("flonum->fixnum", &compile_flonum_to_fixnum));
  fm.insert(std::pair<std::string, fun_ptr>("flonum-expt", &compile_flonum_expt));
  fm.insert(std::pair<std::string, fun_ptr>("%flush-output-port", &compile_flush_output_port));
  fm.insert(std::pair<std::string, fun_ptr>("fx=?", &compile_fx_equal));
  fm.insert(std::pair<std::string, fun_ptr>("fx<?", &compile_fx_less));
  fm.insert(std::pair<std::string, fun_ptr>("fx>?", &compile_fx_greater));
  fm.insert(std::pair<std::string, fun_ptr>("fx<=?", &compile_fx_leq));
  fm.insert(std::pair<std::string, fun_ptr>("fx>=?", &compile_fx_geq));
  fm.insert(std::pair<std::string, fun_ptr>("fx+", &compile_fx_add));
  fm.insert(std::pair<std::string, fun_ptr>("fx-", &compile_fx_sub));
  fm.insert(std::pair<std::string, fun_ptr>("fx*", &compile_fx_mul));
  fm.insert(std::pair<std::string, fun_ptr>("fx/", &compile_fx_div));
  fm.insert(std::pair<std::string, fun_ptr>("fxadd1", &compile_fx_add1));
  fm.insert(std::pair<std::string, fun_ptr>("fxsub1", &compile_fx_sub1));
  fm.insert(std::pair<std::string, fun_ptr>("fxzero?", &compile_fx_is_zero));
  fm.insert(std::pair<std::string, fun_ptr>("getenv", &compile_getenv));
  fm.insert(std::pair<std::string, fun_ptr>("halt", &compile_halt));
  fm.insert(std::pair<std::string, fun_ptr>("ieee754-sign", &compile_ieee754_sign));
  fm.insert(std::pair<std::string, fun_ptr>("ieee754-exponent", &compile_ieee754_exponent));
  fm.insert(std::pair<std::string, fun_ptr>("ieee754-mantissa", &compile_ieee754_mantissa));
  fm.insert(std::pair<std::string, fun_ptr>("ieee754-sin", &compile_ieee754_sin));
  fm.insert(std::pair<std::string, fun_ptr>("ieee754-cos", &compile_ieee754_cos));
  fm.insert(std::pair<std::string, fun_ptr>("ieee754-tan", &compile_ieee754_tan));
  fm.insert(std::pair<std::string, fun_ptr>("ieee754-asin", &compile_ieee754_asin));
  fm.insert(std::pair<std::string, fun_ptr>("ieee754-acos", &compile_ieee754_acos));
  fm.insert(std::pair<std::string, fun_ptr>("ieee754-atan1", &compile_ieee754_atan1));
  fm.insert(std::pair<std::string, fun_ptr>("ieee754-log", &compile_ieee754_log));
  fm.insert(std::pair<std::string, fun_ptr>("ieee754-round", &compile_ieee754_round));
  fm.insert(std::pair<std::string, fun_ptr>("ieee754-sqrt", &compile_ieee754_sqrt));
  fm.insert(std::pair<std::string, fun_ptr>("ieee754-truncate", &compile_ieee754_truncate));
  fm.insert(std::pair<std::string, fun_ptr>("ieee754-pi", &compile_ieee754_pi));
  fm.insert(std::pair<std::string, fun_ptr>("input-port?", &compile_is_input_port));
  fm.insert(std::pair<std::string, fun_ptr>("load", &compile_load));
  fm.insert(std::pair<std::string, fun_ptr>("length", &compile_length));
  fm.insert(std::pair<std::string, fun_ptr>("list", &compile_list));
  fm.insert(std::pair<std::string, fun_ptr>("make-port", &compile_make_port));
  fm.insert(std::pair<std::string, fun_ptr>("%make-promise", &compile_make_promise));
  fm.insert(std::pair<std::string, fun_ptr>("make-string", &compile_make_string));
  fm.insert(std::pair<std::string, fun_ptr>("make-vector", &compile_make_vector));
  fm.insert(std::pair<std::string, fun_ptr>("max", &compile_max));
  fm.insert(std::pair<std::string, fun_ptr>("member", &compile_member));
  fm.insert(std::pair<std::string, fun_ptr>("memq", &compile_memq));
  fm.insert(std::pair<std::string, fun_ptr>("memv", &compile_memv));
  fm.insert(std::pair<std::string, fun_ptr>("min", &compile_min));
  fm.insert(std::pair<std::string, fun_ptr>("not", &compile_not));
  fm.insert(std::pair<std::string, fun_ptr>("null?", &compile_is_nil));
  fm.insert(std::pair<std::string, fun_ptr>("num2str", &compile_num2str));
  fm.insert(std::pair<std::string, fun_ptr>("open-file", &compile_open_file));
  fm.insert(std::pair<std::string, fun_ptr>("output-port?", &compile_is_output_port));
  fm.insert(std::pair<std::string, fun_ptr>("%peek-char", &compile_peek_char));
  fm.insert(std::pair<std::string, fun_ptr>("pair?", &compile_is_pair));
  fm.insert(std::pair<std::string, fun_ptr>("port?", &compile_is_port));
  fm.insert(std::pair<std::string, fun_ptr>("procedure?", &compile_is_procedure));
  fm.insert(std::pair<std::string, fun_ptr>("promise?", &compile_is_promise));
  fm.insert(std::pair<std::string, fun_ptr>("putenv", &compile_putenv));
  fm.insert(std::pair<std::string, fun_ptr>("quotient", &compile_quotient));
  fm.insert(std::pair<std::string, fun_ptr>("%read-char", &compile_read_char));
  fm.insert(std::pair<std::string, fun_ptr>("reclaim", &compile_reclaim));
  fm.insert(std::pair<std::string, fun_ptr>("reclaim-garbage", &compile_reclaim_garbage));
  fm.insert(std::pair<std::string, fun_ptr>("remainder", &compile_remainder));
  fm.insert(std::pair<std::string, fun_ptr>("set-car!", &compile_set_car));
  fm.insert(std::pair<std::string, fun_ptr>("set-cdr!", &compile_set_cdr));
  fm.insert(std::pair<std::string, fun_ptr>("str2num", &compile_str2num));
  fm.insert(std::pair<std::string, fun_ptr>("string", &compile_string));
  fm.insert(std::pair<std::string, fun_ptr>("string-hash", &compile_string_hash));
  fm.insert(std::pair<std::string, fun_ptr>("string?", &compile_is_string));
  fm.insert(std::pair<std::string, fun_ptr>("string-append1", &compile_string_append1));
  fm.insert(std::pair<std::string, fun_ptr>("string-copy", &compile_string_copy));
  fm.insert(std::pair<std::string, fun_ptr>("string-fill!", &compile_string_fill));
  fm.insert(std::pair<std::string, fun_ptr>("string-length", &compile_string_length));
  fm.insert(std::pair<std::string, fun_ptr>("string-ref", &compile_string_ref));
  fm.insert(std::pair<std::string, fun_ptr>("string-set!", &compile_string_set));
  fm.insert(std::pair<std::string, fun_ptr>("substring", &compile_substring));
  fm.insert(std::pair<std::string, fun_ptr>("symbol->string", &compile_symbol_to_string));
  fm.insert(std::pair<std::string, fun_ptr>("symbol?", &compile_is_symbol));
  fm.insert(std::pair<std::string, fun_ptr>("sub1", &compile_sub1));
  fm.insert(std::pair<std::string, fun_ptr>("vector", &compile_vector));
  fm.insert(std::pair<std::string, fun_ptr>("vector?", &compile_is_vector));
  fm.insert(std::pair<std::string, fun_ptr>("vector-fill!", &compile_vector_fill));
  fm.insert(std::pair<std::string, fun_ptr>("vector-length", &compile_vector_length));
  fm.insert(std::pair<std::string, fun_ptr>("vector-ref", &compile_vector_ref));
  fm.insert(std::pair<std::string, fun_ptr>("vector-set!", &compile_vector_set));
  fm.insert(std::pair<std::string, fun_ptr>("%write-char", &compile_write_char));
  fm.insert(std::pair<std::string, fun_ptr>("%write-string", &compile_write_string));
  fm.insert(std::pair<std::string, fun_ptr>("zero?", &compile_is_zero));
  return fm;
  }